

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

LY_ERR ly_strcat(char **dest,char *format,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t local_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  size_t local_48;
  size_t len;
  char *addition;
  va_list fp;
  char *format_local;
  char **dest_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  len = 0;
  fp[0].overflow_arg_area = local_f8;
  fp[0]._0_8_ = &stack0x00000008;
  addition._4_4_ = 0x30;
  addition._0_4_ = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  fp[0].reg_save_area = format;
  iVar1 = vasprintf((char **)&len,format,&addition);
  local_48 = (size_t)iVar1;
  if (*dest == (char *)0x0) {
    local_100 = 0;
  }
  else {
    local_100 = strlen(*dest);
  }
  local_48 = local_100 + 1 + local_48;
  if (*dest == (char *)0x0) {
    *dest = (char *)len;
  }
  else {
    pcVar2 = (char *)ly_realloc(*dest,local_48);
    *dest = pcVar2;
    if (*dest == (char *)0x0) {
      return LY_EMEM;
    }
    pcVar2 = strcat(*dest,(char *)len);
    *dest = pcVar2;
    free((void *)len);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
ly_strcat(char **dest, const char *format, ...)
{
    va_list fp;
    char *addition = NULL;
    size_t len;

    va_start(fp, format);
    len = vasprintf(&addition, format, fp);
    len += (*dest ? strlen(*dest) : 0) + 1;

    if (*dest) {
        *dest = ly_realloc(*dest, len);
        if (!*dest) {
            va_end(fp);
            return LY_EMEM;
        }
        *dest = strcat(*dest, addition);
        free(addition);
    } else {
        *dest = addition;
    }

    va_end(fp);
    return LY_SUCCESS;
}